

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O0

void __thiscall DetectorSS::Copybmp(DetectorSS *this,uchar *dst,uchar *src,int start,int len)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  sbyte sVar4;
  int pos2;
  int pos;
  int index;
  int n;
  uchar temp;
  int curlen;
  int len_local;
  int start_local;
  uchar *src_local;
  uchar *dst_local;
  DetectorSS *this_local;
  int iVar5;
  
  for (curlen = 0; curlen < len; curlen = (8 - uVar3) + curlen) {
    iVar1 = start + curlen >> 3;
    uVar2 = start + curlen & 7;
    uVar3 = curlen & 7;
    iVar5 = curlen >> 3;
    sVar4 = (sbyte)uVar2;
    if ((int)(8 - uVar2) < (int)(8 - uVar3)) {
      dst[iVar5] = dst[iVar5] |
                   (src[iVar1] & (byte)(0xff >> sVar4)) << (sVar4 - (char)uVar3 & 0x1fU);
      uVar3 = uVar2;
    }
    else {
      dst[iVar5] = dst[iVar5] |
                   (byte)((int)(uint)(src[iVar1] & (byte)(0xff >> sVar4)) >>
                         ((char)uVar3 - sVar4 & 0x1fU));
    }
  }
  return;
}

Assistant:

void DetectorSS::Copybmp(unsigned char* dst, unsigned char* src, int start, int len) {
	int curlen = 0;
	while (curlen < len) {
		unsigned char temp = 0;
		int n = start + curlen;
		int index = n >> 3;
		int pos = n & 0x07;
		int pos2 = curlen & 0x07;
		if ((8 - pos2) > (8 - pos)) {
			temp |= src[index] & (0xff >> pos);
			temp <<= (pos - pos2);
			dst[curlen >> 3] |= temp;
			curlen += 8 - pos;
		}
		else {
			temp |= src[index] & (0xff >> pos);
			temp >>= (pos2 - pos);
			dst[curlen >> 3] |= temp;
			curlen += 8 - pos2;
		}
	}
}